

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_seed_entry.hpp
# Opt level: O0

void __thiscall libtorrent::web_seed_entry::~web_seed_entry(web_seed_entry *this)

{
  web_seed_entry *this_local;
  
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->extra_headers);
  ::std::__cxx11::string::~string((string *)&this->auth);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

struct TORRENT_EXPORT web_seed_entry
{
#if TORRENT_ABI_VERSION < 4
	// http seeds are different from url seeds in the
	// protocol they use. http seeds follows the original
	// http seed spec. by John Hoffman
	enum TORRENT_DEPRECATED type_t { url_seed, http_seed };
#endif

	using headers_t = std::vector<std::pair<std::string, std::string>>;

	// hidden
	explicit web_seed_entry(std::string url_
		, std::string auth_ = std::string()
		, headers_t extra_headers_ = headers_t());

	web_seed_entry(web_seed_entry const&);
	web_seed_entry(web_seed_entry&&);
	web_seed_entry& operator=(web_seed_entry const&);
	web_seed_entry& operator=(web_seed_entry&&);

	// URL and type comparison
	bool operator==(web_seed_entry const& e) const
	{ return url == e.url; }

	// URL and type less-than comparison
	bool operator<(web_seed_entry const& e) const
	{ return url < e.url; }

	// The URL of the web seed
	std::string url;

	// Optional authentication. If this is set, it's passed
	// in as HTTP basic auth to the web seed. The format is:
	// username:password.
	std::string auth;

	// Any extra HTTP headers that need to be passed to the web seed
	headers_t extra_headers;

#if TORRENT_ABI_VERSION < 4
	// The type of web seed (see type_t)
	TORRENT_DEPRECATED
	std::uint8_t type = 0;
#endif
}